

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.cpp
# Opt level: O0

void __thiscall
setup::info::load_entries<setup::ini_entry>
          (info *this,istream *is,entry_types entries,size_t count,
          vector<setup::ini_entry,_std::allocator<setup::ini_entry>_> *result,enum_type entry_type)

{
  TypesafeBoolean p_Var1;
  ulong in_RCX;
  flags<setup::info::entry_types_Enum_,_21UL> *in_RDI;
  vector<setup::ini_entry,_std::allocator<setup::ini_entry>_> *in_R8;
  ini_entry entry;
  size_t i_1;
  size_t i;
  undefined8 in_stack_fffffffffffffe10;
  enum_type flag;
  ini_entry *this_00;
  size_type in_stack_fffffffffffffe28;
  vector<setup::ini_entry,_std::allocator<setup::ini_entry>_> *in_stack_fffffffffffffe30;
  undefined8 in_stack_fffffffffffffe40;
  info *in_stack_fffffffffffffeb0;
  istream *in_stack_fffffffffffffeb8;
  undefined8 in_stack_fffffffffffffec0;
  ulong local_48;
  ulong local_40;
  
  flag = (enum_type)((ulong)in_stack_fffffffffffffe10 >> 0x20);
  std::vector<setup::ini_entry,_std::allocator<setup::ini_entry>_>::clear
            ((vector<setup::ini_entry,_std::allocator<setup::ini_entry>_> *)0x17a9f1);
  flags<setup::info::entry_types_Enum_,_21UL>::operator&(in_RDI,flag);
  p_Var1 = ::flags::operator_cast_to_function_pointer
                     ((flags<setup::directory_entry::flags_Enum_,_5UL> *)0x17aa1a);
  if (p_Var1 == (TypesafeBoolean)0x0) {
    for (local_48 = 0; local_48 < in_RCX; local_48 = local_48 + 1) {
      this_00 = (ini_entry *)&stack0xfffffffffffffe30;
      ini_entry::ini_entry((ini_entry *)in_stack_fffffffffffffe40);
      ini_entry::load((ini_entry *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
                      in_stack_fffffffffffffeb0);
      registry_entry::~registry_entry(this_00);
    }
  }
  else {
    std::vector<setup::ini_entry,_std::allocator<setup::ini_entry>_>::resize
              (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
    for (local_40 = 0; local_40 < in_RCX; local_40 = local_40 + 1) {
      std::vector<setup::ini_entry,_std::allocator<setup::ini_entry>_>::operator[](in_R8,local_40);
      ini_entry::load((ini_entry *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
                      in_stack_fffffffffffffeb0);
    }
  }
  return;
}

Assistant:

void info::load_entries(std::istream & is, entry_types entries, size_t count,
                        std::vector<Entry> & result, entry_types::enum_type entry_type) {
	
	result.clear();
	if(entries & entry_type) {
		result.resize(count);
		for(size_t i = 0; i < count; i++) {
			result[i].load(is, *this);
		}
	} else {
		for(size_t i = 0; i < count; i++) {
			Entry entry;
			entry.load(is, *this);
		}
	}
}